

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcins(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ninsert,LONGLONG bytepos,
          int *status)

{
  fitsfile *fptr_00;
  long lVar1;
  long lVar2;
  long lVar3;
  uchar *puVar4;
  size_t in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  LONGLONG ii;
  LONGLONG nseg;
  LONGLONG irow;
  LONGLONG nbytes;
  LONGLONG fbyte;
  LONGLONG newlen;
  uchar cfill;
  uchar buffer [10000];
  size_t local_2788;
  int *piVar5;
  uchar *in_stack_ffffffffffffd888;
  LONGLONG in_stack_ffffffffffffd890;
  byte local_2749;
  byte local_2748 [40];
  int *in_stack_ffffffffffffd8e0;
  uchar *in_stack_ffffffffffffd8e8;
  LONGLONG in_stack_ffffffffffffd8f0;
  LONGLONG in_stack_ffffffffffffd8f8;
  LONGLONG in_stack_ffffffffffffd900;
  fitsfile *in_stack_ffffffffffffd908;
  int local_4;
  
  if (*in_R9 < 1) {
    if (in_RDX == 0) {
      local_4 = *in_R9;
    }
    else {
      if (*(int *)(*(long *)(in_RDI + 8) + 0x58) == 1) {
        local_2749 = 0x20;
      }
      else {
        local_2749 = 0;
      }
      fptr_00 = (fitsfile *)(in_RSI + in_RCX);
      if ((long)fptr_00 < 0x2711) {
        for (piVar5 = (int *)0x0; (long)piVar5 < (long)in_RCX; piVar5 = (int *)((long)piVar5 + 1)) {
          local_2748[(long)piVar5] = local_2749;
        }
        lVar1 = in_R8 + 1;
        lVar2 = in_RSI - in_R8;
        if (*(long *)(*(long *)(in_RDI + 8) + 0x30) <
            *(long *)(*(long *)(in_RDI + 8) + 0x88) + *(long *)(*(long *)(in_RDI + 8) + 0x3d8)) {
          *(long *)(*(long *)(in_RDI + 8) + 0x30) =
               ((*(long *)(*(long *)(in_RDI + 8) + 0x88) + *(long *)(*(long *)(in_RDI + 8) + 0x3d8)
                + 0xb3f) / 0xb40) * 0xb40;
        }
        ffgtbb(fptr_00,lVar1,lVar2,in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,piVar5);
        *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8) = fptr_00;
        lVar2 = in_RCX + lVar2;
        ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
               in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
        *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
        for (lVar3 = in_RDX + -1; 0 < lVar3; lVar3 = lVar3 + -1) {
          ffgtbb(fptr_00,lVar1,lVar2,lVar3,in_stack_ffffffffffffd888,piVar5);
          *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8) = fptr_00;
          ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
        }
      }
      else {
        puVar4 = (uchar *)(((in_RSI - in_R8) + 9999) / 10000);
        lVar1 = (long)(puVar4 + -1) * 10000 + in_R8 + 1;
        lVar2 = (in_RSI - lVar1) + 1;
        for (piVar5 = (int *)0x0; (long)piVar5 < (long)puVar4; piVar5 = (int *)((long)piVar5 + 1)) {
          ffgtbb(fptr_00,lVar1,lVar2,in_stack_ffffffffffffd890,puVar4,piVar5);
          *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8) = fptr_00;
          ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
          lVar1 = lVar1 + -10000;
          lVar2 = 10000;
        }
        puVar4 = (uchar *)((in_RSI + 9999) / 10000);
        for (lVar1 = in_RDX + -1; 0 < lVar1; lVar1 = lVar1 + -1) {
          lVar2 = (long)(puVar4 + -1) * 10000 + in_R8 + 1;
          lVar3 = in_RSI + (long)(puVar4 + -1) * -10000;
          for (piVar5 = (int *)0x0; (long)piVar5 < (long)puVar4; piVar5 = (int *)((long)piVar5 + 1))
          {
            ffgtbb(fptr_00,lVar2,lVar3,lVar1,puVar4,piVar5);
            *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8) = fptr_00;
            ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                   in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
            *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
            lVar2 = lVar2 + -10000;
            lVar3 = 10000;
          }
        }
        local_2788 = in_RCX;
        if (9999 < (long)in_RCX) {
          local_2788 = 10000;
        }
        memset(local_2748,(uint)local_2749,local_2788);
        lVar1 = (long)(in_RCX + 9999) / 10000;
        *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8) = fptr_00;
        for (lVar2 = 1; lVar2 <= in_RDX; lVar2 = lVar2 + 1) {
          for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
            ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                   in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          }
        }
        *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
      }
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffcins(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ninsert,    /* I - number of bytes to insert in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to insert bytes     */
           int *status)     /* IO - error status                            */
/*
 Insert 'ninsert' bytes into each row of the table at position 'bytepos'.
*/
{
    unsigned char buffer[10000], cfill;
    LONGLONG newlen, fbyte, nbytes, irow, nseg, ii;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    /* select appropriate fill value */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        cfill = 32;                     /* ASCII tables use blank fill */
    else
        cfill = 0;    /* primary array and binary tables use zero fill */

    newlen = naxis1 + ninsert;

    if (newlen <= 10000)
    {
       /*******************************************************************
       CASE #1: optimal case where whole new row fits in the work buffer
       *******************************************************************/

        for (ii = 0; ii < ninsert; ii++)
            buffer[ii] = cfill;      /* initialize buffer with fill value */

        /* first move the trailing bytes (if any) in the last row */
        fbyte = bytepos + 1;
        nbytes = naxis1 - bytepos;
        /* If the last row hasn't yet been accessed in full, it's possible
           that logfilesize hasn't been updated to account for it (by way
           of an ffldrc call).  This could cause ffgtbb to return with an
           EOF error.  To prevent this, we must increase logfilesize here. 
        */
        if ((fptr->Fptr)->logfilesize < (fptr->Fptr)->datastart + 
                 (fptr->Fptr)->heapstart)
        {
            (fptr->Fptr)->logfilesize = (((fptr->Fptr)->datastart +
                 (fptr->Fptr)->heapstart + 2879)/2880)*2880;
        }
        
        ffgtbb(fptr, naxis2, fbyte, nbytes, &buffer[ninsert], status);
        (fptr->Fptr)->rowlength = newlen; /*  new row length */

        /* write the row (with leading fill bytes) in the new place */
        nbytes += ninsert;
        ffptbb(fptr, naxis2, fbyte, nbytes, buffer, status);
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig. value */

        /*  now move the rest of the rows */
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, naxis1, &buffer[ninsert], status);
            (fptr->Fptr)->rowlength = newlen; /* new row length */

            /* write the row (with the leading fill bytes) in the new place */
            ffptbb(fptr, irow, fbyte, newlen, buffer, status);
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */
        }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************
        first copy the data, then go back and write fill into the new column
        start by copying the trailing bytes (if any) in the last row.     */

        nbytes = naxis1 - bytepos;
        nseg = (nbytes + 9999) / 10000;
        fbyte = (nseg - 1) * 10000 + bytepos + 1;
        nbytes = naxis1 - fbyte + 1;

        for (ii = 0; ii < nseg; ii++)
        {
            ffgtbb(fptr, naxis2, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            ffptbb(fptr, naxis2, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
        }

        /* now move the rest of the rows */
        nseg = (naxis1 + 9999) / 10000;
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
          fbyte = (nseg - 1) * 10000 + bytepos + 1;
          nbytes = naxis1 - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            /* write the row in the new place */
            ffptbb(fptr, irow, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
          }
        }

        /* now write the fill values into the new column */
        nbytes = minvalue(ninsert, 10000);
        memset(buffer, cfill, (size_t) nbytes); /* initialize with fill value */

        nseg = (ninsert + 9999) / 10000;
        (fptr->Fptr)->rowlength =  newlen;  /* new row length */

        for (irow = 1; irow <= naxis2; irow++)
        {
          fbyte = bytepos + 1;
          nbytes = ninsert - ((nseg - 1) * 10000);
          for (ii = 0; ii < nseg; ii++)
          {
            ffptbb(fptr, irow, fbyte, nbytes, buffer, status);
            fbyte += nbytes;
            nbytes = 10000;
          }
        }
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
    }
    return(*status);
}